

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  ostream *poVar1;
  uchar value;
  size_t i;
  ulong uVar2;
  byte bVar3;
  char *pcVar4;
  uint uVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  string local_50;
  
  Message::Message((Message *)&local_58);
  poVar1 = (ostream *)(local_58._M_head_impl + 0x10);
  uVar2 = 0;
  do {
    if (str->_M_string_length <= uVar2) {
      StringStreamToString(__return_storage_ptr__,local_58._M_head_impl);
      if (local_58._M_head_impl != (stringstream *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))(local_58._M_head_impl);
      }
      return __return_storage_ptr__;
    }
    bVar3 = (str->_M_dataplus)._M_p[uVar2];
    if (bVar3 == 0x22) {
      if (is_attribute) {
        pcVar4 = "&quot;";
        goto LAB_00153bac;
      }
      bVar3 = 0x22;
LAB_00153bc3:
      std::operator<<(poVar1,bVar3);
    }
    else {
      if (bVar3 == 0x26) {
        pcVar4 = "&amp;";
      }
      else if (bVar3 == 0x27) {
        if (!is_attribute) {
          bVar3 = 0x27;
          goto LAB_00153bc3;
        }
        pcVar4 = "&apos;";
      }
      else if (bVar3 == 0x3e) {
        pcVar4 = "&gt;";
      }
      else {
        if (bVar3 != 0x3c) {
          uVar5 = (uint)bVar3;
          if (('\x1f' < (char)bVar3) || ((bVar3 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0)))) {
            if ((!is_attribute) || ((0xd < uVar5 || ((0x2600U >> (uVar5 & 0x1f) & 1) == 0))))
            goto LAB_00153bc3;
            std::operator<<(poVar1,"&#x");
            String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)uVar5,value);
            std::operator<<(poVar1,(string *)&local_50);
            std::operator<<(poVar1,";");
            std::__cxx11::string::_M_dispose();
          }
          goto LAB_00153bc8;
        }
        pcVar4 = "&lt;";
      }
LAB_00153bac:
      std::operator<<(poVar1,pcVar4);
    }
LAB_00153bc8:
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}